

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

int stmm_add_direct(stmm_table *table,char *key,char *value)

{
  stmm_hash_func_type p_Var1;
  stmm_table_entry **ppsVar2;
  int iVar3;
  stmm_table_entry *psVar4;
  int iVar5;
  
  p_Var1 = table->hash;
  if (p_Var1 != stmm_numhash && p_Var1 != stmm_ptrhash) {
    (*p_Var1)(key,table->num_bins);
  }
  if ((table->max_density <= table->num_entries / table->num_bins) &&
     (iVar3 = rehash(table), iVar3 == -10000)) {
    return -10000;
  }
  p_Var1 = table->hash;
  if (p_Var1 == stmm_ptrhash) {
    iVar3 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var1 == stmm_numhash) {
    iVar5 = (int)key;
    iVar3 = -iVar5;
    if (0 < iVar5) {
      iVar3 = iVar5;
    }
    iVar3 = iVar3 % table->num_bins;
  }
  else {
    iVar3 = (*p_Var1)(key,table->num_bins);
  }
  psVar4 = (stmm_table_entry *)Extra_MmFixedEntryFetch((Extra_MmFixed_t *)table->pMemMan);
  if (psVar4 == (stmm_table_entry *)0x0) {
    iVar3 = -10000;
  }
  else {
    psVar4->key = key;
    psVar4->record = value;
    ppsVar2 = table->bins;
    psVar4->next = ppsVar2[iVar3];
    ppsVar2[iVar3] = psVar4;
    table->num_entries = table->num_entries + 1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int
stmm_add_direct (stmm_table *table, char *key, char *value)
{
    int hash_val;
    stmm_table_entry *newEntry;

    hash_val = do_hash (key, table);
    if (table->num_entries / table->num_bins >= table->max_density) {
    if (rehash (table) == STMM_OUT_OF_MEM) {
        return STMM_OUT_OF_MEM;
    }
    }
    hash_val = do_hash (key, table);

//      newEntry = ABC_ALLOC( stmm_table_entry, 1 );
    newEntry = (stmm_table_entry *) Extra_MmFixedEntryFetch ((Extra_MmFixed_t *)table->pMemMan);
    if (newEntry == NULL) {
    return STMM_OUT_OF_MEM;
    }

    newEntry->key = key;
    newEntry->record = value;
    newEntry->next = table->bins[hash_val];
    table->bins[hash_val] = newEntry;
    table->num_entries++;
    return 1;
}